

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_Tt6FirstBit(word t)

{
  undefined4 local_1c;
  word wStack_18;
  int n;
  word t_local;
  
  local_1c = 0;
  if (t == 0) {
    t_local._4_4_ = -1;
  }
  else {
    wStack_18 = t;
    if ((t & 0xffffffff) == 0) {
      local_1c = 0x20;
      wStack_18 = t >> 0x20;
    }
    if ((wStack_18 & 0xffff) == 0) {
      local_1c = local_1c + 0x10;
      wStack_18 = wStack_18 >> 0x10;
    }
    if ((wStack_18 & 0xff) == 0) {
      local_1c = local_1c + 8;
      wStack_18 = wStack_18 >> 8;
    }
    if ((wStack_18 & 0xf) == 0) {
      local_1c = local_1c + 4;
      wStack_18 = wStack_18 >> 4;
    }
    if ((wStack_18 & 3) == 0) {
      local_1c = local_1c + 2;
      wStack_18 = wStack_18 >> 2;
    }
    if ((wStack_18 & 1) == 0) {
      local_1c = local_1c + 1;
    }
    t_local._4_4_ = local_1c;
  }
  return t_local._4_4_;
}

Assistant:

static inline int Abc_Tt6FirstBit( word t )
{
    int n = 0;
    if ( t == 0 ) return -1;
    if ( (t & ABC_CONST(0x00000000FFFFFFFF)) == 0 ) { n += 32; t >>= 32; }
    if ( (t & ABC_CONST(0x000000000000FFFF)) == 0 ) { n += 16; t >>= 16; }
    if ( (t & ABC_CONST(0x00000000000000FF)) == 0 ) { n +=  8; t >>=  8; }
    if ( (t & ABC_CONST(0x000000000000000F)) == 0 ) { n +=  4; t >>=  4; }
    if ( (t & ABC_CONST(0x0000000000000003)) == 0 ) { n +=  2; t >>=  2; }
    if ( (t & ABC_CONST(0x0000000000000001)) == 0 ) { n++; }
    return n;
}